

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

bool __thiscall Inline::GetInlineeHasArgumentObject(Inline *this,Func *inlinee)

{
  OpCode OVar1;
  Instr *instr;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BuiltinFunction BVar5;
  LocalFunctionId localFuncId;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  AddrOpnd *pAVar8;
  undefined **this_01;
  char *pcVar9;
  Inline *this_02;
  Instr **ppIVar10;
  SymID argumentsSymId;
  Instr *pIVar11;
  
  this_00 = Func::GetJITFunctionBody(inlinee);
  bVar3 = JITTimeFunctionBody::UsesArgumentsObject(this_00);
  if (bVar3) {
    bVar3 = true;
    if ((inlinee->field_0x241 & 0x10) != 0) {
      ppIVar10 = &inlinee->m_headInstr;
      this_01 = &PTR_013e5f18;
      puVar6 = (undefined4 *)__tls_get_addr();
      argumentsSymId = 0;
      pIVar11 = (Instr *)0x0;
      while( true ) {
        instr = *ppIVar10;
        bVar3 = instr != (Instr *)0x0;
        if (instr == (Instr *)0x0) break;
        if ((pIVar11 != (Instr *)0x0) && (pIVar11->m_next != instr)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          pcVar9 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
          ;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x16a9,
                             "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                             "Modifying instr list but not using EDITING iterator!");
          if (!bVar4) goto LAB_0050d142;
          *puVar6 = 0;
          this_01 = (undefined **)pcVar9;
        }
        if (instr->m_func == inlinee) {
          OVar1 = instr->m_opcode;
          if ((ushort)(OVar1 - LdHeapArguments) < 2) {
            this_01 = (undefined **)instr->m_dst;
            pRVar7 = IR::Opnd::AsRegOpnd((Opnd *)this_01);
            argumentsSymId = (pRVar7->m_sym->super_Sym).m_id;
          }
          else if (argumentsSymId == 0) {
            argumentsSymId = 0;
          }
          else if ((1 < OVar1 - 0x242) && (OVar1 != ArgOut_A_InlineBuiltIn)) {
            if (OVar1 == ArgOut_A_FromStackArgs) {
              if (this->isInInlinedApplyCall == true) {
LAB_0050d0e0:
                bVar4 = HasArgumentsAccess((Inline *)this_01,instr,argumentsSymId);
                if (bVar4) {
                  return bVar3;
                }
              }
            }
            else if (OVar1 != BailOnNotStackArgs) {
              if (OVar1 == InlineBuiltInEnd) {
                if (this->isInInlinedApplyCall == true) {
                  this->isInInlinedApplyCall = false;
                }
              }
              else {
                if (OVar1 != InlineBuiltInStart) goto LAB_0050d0e0;
                this_02 = (Inline *)instr->m_src1;
                bVar3 = IR::Opnd::IsAddrOpnd((Opnd *)this_02);
                if (bVar3) {
                  pAVar8 = IR::Opnd::AsAddrOpnd((Opnd *)this_02);
                  if ((pAVar8->field_0x28 & 2) == 0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar6 = 1;
                    bVar3 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                       ,0x16c0,"(builtInOpnd->AsAddrOpnd()->m_isFunction)",
                                       "builtInOpnd->AsAddrOpnd()->m_isFunction");
                    if (!bVar3) {
LAB_0050d142:
                      pcVar2 = (code *)invalidInstructionException();
                      (*pcVar2)();
                    }
                    *puVar6 = 0;
                  }
                  pAVar8 = IR::Opnd::AsAddrOpnd((Opnd *)this_02);
                  localFuncId = FixedFieldInfo::GetLocalFuncId((FixedFieldInfo *)pAVar8->m_metadata)
                  ;
                  this_01 = (undefined **)(ulong)localFuncId;
                  BVar5 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(localFuncId);
                }
                else {
                  this_01 = (undefined **)this_02;
                  bVar3 = IR::Opnd::IsRegOpnd((Opnd *)this_02);
                  if (!bVar3) goto LAB_0050d124;
                  pRVar7 = IR::Opnd::AsRegOpnd((Opnd *)this_02);
                  BVar5._value = (pRVar7->m_sym->m_builtInIndex)._value;
                  this_01 = (undefined **)this_02;
                }
                if (BVar5._value == '<') {
                  this->isInInlinedApplyCall = true;
                }
              }
            }
          }
        }
LAB_0050d124:
        ppIVar10 = &instr->m_next;
        pIVar11 = instr;
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
Inline::GetInlineeHasArgumentObject(Func * inlinee)
{
    if (!inlinee->GetJITFunctionBody()->UsesArgumentsObject())
    {
        // If inlinee has no arguments access return false
        return false;
    }

    // Inlinee has arguments access

    if (!inlinee->GetApplyTargetInliningRemovedArgumentsAccess())
    {
        return true;
    }

    // Its possible there is no more arguments access after we inline apply target; validate the same.
    // This sounds expensive, but we are only walking inlinee which has apply target inlining optimization enabled.
    // Also we walk only instruction in that inlinee and not nested inlinees. So it is not expensive.
    SymID argumentsSymId = 0;
    FOREACH_INSTR_IN_FUNC(instr, inlinee)
    {
        if (instr->m_func != inlinee)
        {
            // Skip nested inlinees
            continue;
        }

        if (instr->m_opcode == Js::OpCode::LdHeapArguments || instr->m_opcode == Js::OpCode::LdLetHeapArguments)
        {
            argumentsSymId = instr->GetDst()->AsRegOpnd()->m_sym->m_id;
        }
        else if (argumentsSymId != 0)
        {
            // Once we find the arguments object i.e. argumentsSymId is set
            // Make sure no one refers to it.
            switch (instr->m_opcode)
            {
                case Js::OpCode::InlineBuiltInStart:
                    {
                        IR::Opnd* builtInOpnd = instr->GetSrc1();
                        if (builtInOpnd->IsAddrOpnd())
                        {
                            Assert(builtInOpnd->AsAddrOpnd()->m_isFunction);

                            Js::BuiltinFunction builtinFunction = Js::JavascriptLibrary::GetBuiltInForFuncInfo(((FixedFieldInfo*)builtInOpnd->AsAddrOpnd()->m_metadata)->GetLocalFuncId());
                            if (builtinFunction == Js::BuiltinFunction::JavascriptFunction_Apply)
                            {
                                this->SetIsInInlinedApplyCall(true);
                            }
                        }
                        else if (builtInOpnd->IsRegOpnd())
                        {
                            if (builtInOpnd->AsRegOpnd()->m_sym->m_builtInIndex == Js::BuiltinFunction::JavascriptFunction_Apply)
                            {
                                this->SetIsInInlinedApplyCall(true);
                            }
                        }
                        break;
                    }

                case Js::OpCode::InlineBuiltInEnd:
                    {
                        if(this->GetIsInInlinedApplyCall())
                        {
                            this->SetIsInInlinedApplyCall(false);
                        }
                        break;
                    }

                case Js::OpCode::BailOnNotStackArgs:
                case Js::OpCode::ArgOut_A_InlineBuiltIn:
                case Js::OpCode::BytecodeArgOutCapture:
                case Js::OpCode::BytecodeArgOutUse:
                    // These are part of arguments optimization and we are fine if they access stack args.
                    break;

                case Js::OpCode::ArgOut_A_FromStackArgs:
                    {
                        // If ArgOut_A_FromStackArgs is part of the call sequence for apply built-in inlining (as opposed to apply target inlining),
                        // then arguments access continues to exist.
                        if (this->GetIsInInlinedApplyCall() && HasArgumentsAccess(instr, argumentsSymId))
                        {
                            return true;
                        }
                        break;
                    }

                default:
                    {
                        if (HasArgumentsAccess(instr, argumentsSymId))
                        {
                            return true;
                        }
                    }
            }
        }
    }
    NEXT_INSTR_IN_FUNC;
    return false;
}